

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *This,ktx_uint32_t level)

{
  ktx_size_t kVar1;
  uint level_00;
  ktx_size_t kVar2;
  undefined1 auVar3 [16];
  float fVar4;
  
  if (This == (ktxTexture2 *)0x0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x683,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
  }
  if (This->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    level_00 = This->numLevels;
    if (level < level_00) {
      kVar2 = 0;
      while (level_00 = level_00 - 1, level < level_00) {
        kVar1 = ktxTexture_calcLevelSize((ktxTexture *)This,level_00,KTX_FORMAT_VERSION_TWO);
        fVar4 = (float)This->_private->_requiredLevelAlignment;
        auVar3 = ZEXT416((uint)((float)kVar1 / fVar4));
        auVar3 = roundss(auVar3,auVar3,10);
        kVar2 = kVar2 + ((long)(auVar3._0_4_ * fVar4) & 0xffffffffU);
      }
      return kVar2;
    }
    __assert_fail("level < This->numLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x685,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
  }
  __assert_fail("This->supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x684,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture2_calcLevelOffset(ktxTexture2* This, ktx_uint32_t level)
{
  assert (This != NULL);
  assert(This->supercompressionScheme == KTX_SS_NONE);
  assert (level < This->numLevels);
  ktx_size_t levelOffset = 0;
  for (ktx_uint32_t i = This->numLevels - 1; i > level; i--) {
      ktx_size_t levelSize;
      levelSize = ktxTexture_calcLevelSize(ktxTexture(This), i,
                                           KTX_FORMAT_VERSION_TWO);
      levelOffset += _KTX_PADN(This->_private->_requiredLevelAlignment,
                               levelSize);
  }
  return levelOffset;
}